

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfw.c
# Opt level: O0

uint32_t MMFW_EntryLength(MMFWEntry *entry)

{
  MMFWKind MVar1;
  MMFWEntry *entry_local;
  
  MVar1 = entry->kind;
  if (MVar1 == MMFW_KIND_SOUNDS) {
    entry_local._4_4_ = ((entry->entry).sound)->length;
  }
  else if (MVar1 == MMFW_KIND_PICTURES) {
    entry_local._4_4_ = ((entry->entry).picture)->length;
  }
  else if (MVar1 == MMFW_KIND_FILMS) {
    entry_local._4_4_ = ((entry->entry).picture)->length;
  }
  else {
    entry_local._4_4_ = 0;
  }
  return entry_local._4_4_;
}

Assistant:

uint32_t
MMFW_EntryLength(const MMFWEntry *entry)
{
	switch (entry->kind) {
	case MMFW_KIND_SOUNDS:
		return entry->entry.sound->length;
		break;
	case MMFW_KIND_PICTURES:
		return entry->entry.picture->length;
		break;
	case MMFW_KIND_FILMS:
		return entry->entry.film->length;
		break;
	default:
		return 0; /* XXX NOTREACHED */
	}
}